

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O2

void fekete_rule(int rule,int param_2,double *xy,double *w)

{
  uint suborder_num;
  int iVar1;
  int iVar2;
  int iVar3;
  double *suborder_xyz;
  double *suborder_w;
  int *piVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  double *pdVar10;
  double *local_48;
  double *local_40;
  
  suborder_num = fekete_suborder_num(rule);
  suborder_xyz = (double *)operator_new__((ulong)(suborder_num * 0x18));
  suborder_w = (double *)operator_new__((ulong)(suborder_num * 8));
  piVar4 = fekete_suborder(rule,suborder_num);
  fekete_subrule(rule,suborder_num,suborder_xyz,suborder_w);
  uVar8 = 0;
  iVar2 = 0;
  do {
    if (uVar8 == suborder_num) {
      operator_delete__(piVar4);
      operator_delete__(suborder_xyz);
      operator_delete__(suborder_w);
      return;
    }
    iVar1 = piVar4[uVar8];
    lVar7 = (long)iVar2;
    if (iVar1 == 1) {
      xy[iVar2 * 2] = suborder_xyz[uVar8 * 3];
      xy[iVar2 * 2 + 1] = suborder_xyz[uVar8 * 3 + 1];
      w[lVar7] = suborder_w[uVar8];
      iVar2 = iVar2 + 1;
    }
    else {
      iVar9 = (int)uVar8;
      if (iVar1 == 3) {
        pdVar10 = xy + lVar7 * 2 + 1;
        lVar6 = 0;
        while ((int)lVar6 != 3) {
          iVar1 = i4_wrap((int)lVar6,0,2);
          pdVar10[-1] = suborder_xyz[iVar1 + iVar9 * 3];
          iVar1 = i4_wrap((int)(lVar6 + 1),0,2);
          *pdVar10 = suborder_xyz[iVar1 + iVar9 * 3];
          w[lVar7 + lVar6] = suborder_w[uVar8];
          pdVar10 = pdVar10 + 2;
          lVar6 = lVar6 + 1;
        }
        iVar2 = iVar2 + 3;
      }
      else {
        if (iVar1 != 6) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"FEKETE_RULE - Fatal error!\n;");
          poVar5 = std::operator<<((ostream *)&std::cerr,"  Illegal SUBORDER(");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          poVar5 = std::operator<<(poVar5,") = ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,piVar4[uVar8]);
          std::operator<<(poVar5,"\n");
          exit(1);
        }
        iVar9 = iVar9 * 3;
        local_48 = xy + lVar7 * 2 + 1;
        lVar6 = 0;
        local_40 = w + lVar7;
        while ((int)lVar6 != 3) {
          iVar1 = i4_wrap((int)lVar6,0,2);
          local_48[-1] = suborder_xyz[iVar1 + iVar9];
          iVar1 = i4_wrap((int)(lVar6 + 1),0,2);
          *local_48 = suborder_xyz[iVar1 + iVar9];
          (w + lVar7)[lVar6] = suborder_w[uVar8];
          local_48 = local_48 + 2;
          local_40 = local_40 + 1;
          lVar6 = lVar6 + 1;
        }
        iVar2 = iVar2 + 6;
        iVar1 = 0;
        for (lVar7 = 0; (int)lVar7 != 6; lVar7 = lVar7 + 2) {
          iVar3 = i4_wrap(iVar1 + 1,0,2);
          local_48[lVar7 + -1] = suborder_xyz[iVar3 + iVar9];
          iVar3 = i4_wrap(iVar1,0,2);
          local_48[lVar7] = suborder_xyz[iVar3 + iVar9];
          *local_40 = suborder_w[uVar8];
          local_40 = local_40 + 1;
          iVar1 = iVar1 + 1;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void fekete_rule ( int rule, int /*order_num*/, double xy[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_RULE returns the points and weights of a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 January 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int ORDER_NUM, the order (number of points) of the rule.
//
//    Output, double XY[2*ORDER_NUM], the points of the rule.
//
//    Output, double W[ORDER_NUM], the weights of the rule.
//
{
  int k;
  int o;
  int s;
  int *suborder;
  int suborder_num;
  double *suborder_w;
  double *suborder_xyz;
//
//  Get the suborder information.
//
  suborder_num = fekete_suborder_num ( rule );

  suborder_xyz = new double[3*suborder_num];
  suborder_w = new double[suborder_num];

  suborder = fekete_suborder ( rule, suborder_num );

  fekete_subrule ( rule, suborder_num, suborder_xyz, suborder_w );
//
//  Expand the suborder information to a full order rule.
//
  o = 0;

  for ( s = 0; s < suborder_num; s++ )
  {
    if ( suborder[s] == 1 )
    {
      xy[0+o*2] = suborder_xyz[0+s*3];
      xy[1+o*2] = suborder_xyz[1+s*3];
      w[o] = suborder_w[s];
      o = o + 1;
    }
    else if ( suborder[s] == 3 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else if ( suborder[s] == 6 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }

      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else
    {
      std::cerr << "\n";
      std::cerr << "FEKETE_RULE - Fatal error!\n;";
      std::cerr << "  Illegal SUBORDER(" << s << ") = " << suborder[s] << "\n";
      exit ( 1 );
    }
  }

  delete [] suborder;
  delete [] suborder_xyz;
  delete [] suborder_w;

  return;
}